

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineBase.cpp
# Opt level: O1

void __thiscall myvk::PipelineBase::~PipelineBase(PipelineBase *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  PFN_vkDestroyPipeline p_Var3;
  int iVar4;
  undefined4 extraout_var;
  
  (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)&PTR__PipelineBase_0032fee0;
  p_Var3 = vkDestroyPipeline;
  if (this->m_pipeline != (VkPipeline)0x0) {
    iVar4 = (*(((this->m_pipeline_layout_ptr).
                super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_DeviceObjectBase).super_Base._vptr_Base[2])();
    (*p_Var3)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar4) + 0x268),this->m_pipeline,
              (VkAllocationCallbacks *)0x0);
  }
  p_Var2 = (this->m_pipeline_layout_ptr).
           super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>.
           _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

PipelineBase::~PipelineBase() {
	if (m_pipeline)
		vkDestroyPipeline(m_pipeline_layout_ptr->GetDevicePtr()->GetHandle(), m_pipeline, nullptr);
}